

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create_table.cpp
# Opt level: O3

unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
__thiscall
duckdb::Binder::BindCreateTableInfo
          (Binder *this,
          unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *info,
          SchemaCatalogEntry *schema,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *bound_defaults)

{
  __node_base_ptr *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<duckdb::PhysicalIndex,_true> *indexes;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  __node_base_ptr p_Var3;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var4;
  pointer pcVar5;
  void *pvVar6;
  pointer pCVar7;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *puVar8;
  pointer pbVar9;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> _Var10;
  optional_ptr<duckdb::Catalog,_true> oVar11;
  undefined1 auVar12 [8];
  optional_ptr<duckdb::CatalogEntry,_true> this_01;
  bool bVar13;
  string sVar14;
  int iVar15;
  pointer pCVar16;
  element_type *this_02;
  pointer pBVar17;
  type stmt;
  ulong uVar18;
  reference pvVar19;
  reference pvVar20;
  type pBVar21;
  reference this_03;
  pointer pCVar22;
  ForeignKeyConstraint *fk;
  ColumnList *pCVar23;
  vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
  *pvVar24;
  undefined4 extraout_var;
  string *psVar25;
  NotNullConstraint *pNVar26;
  CheckConstraint *pCVar27;
  type expr;
  UniqueConstraint *this_04;
  LogicalIndex logical;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *pvVar28;
  const_iterator cVar29;
  Catalog *pCVar30;
  ColumnDefinition *pCVar31;
  LogicalType *pLVar32;
  pointer pBVar33;
  StatementProperties *pSVar34;
  NotImplementedException *this_05;
  BinderException *pBVar35;
  LogicalType *type;
  LogicalType *type_00;
  idx_t i;
  size_type sVar36;
  pointer pbVar37;
  PhysicalIndex PVar38;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_R8;
  optional_idx oVar39;
  size_type __n;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *this_06;
  ColumnListIterator CVar40;
  EntryLookupInfo table_lookup;
  string fk_column_names;
  optional_ptr<duckdb::CatalogEntry,_true> table_entry;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  target_col_names;
  ColumnList new_colums;
  undefined1 local_3f8 [8];
  undefined1 auStack_3f0 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_3d8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_3c0;
  string local_3b8;
  optional_ptr<duckdb::CatalogEntry,_true> local_390;
  undefined1 local_388 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_368;
  undefined1 local_358 [8];
  pointer pCStack_350;
  undefined4 local_348;
  __buckets_ptr local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_338 [2];
  void *local_318;
  __node_base_ptr p_Stack_310;
  pointer local_308;
  undefined1 local_300;
  size_type *local_2f0;
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  local_2e8;
  CatalogEntryRetriever *local_2c8;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *local_2c0;
  pointer local_2b8;
  _Any_data local_2b0;
  code *local_2a0;
  code *local_298;
  string local_290;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  LogicalType local_210;
  LogicalType local_1f8;
  undefined1 local_1e0 [216];
  undefined1 local_108 [216];
  
  local_2c0 = in_R8;
  pCVar16 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
            operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                        *)schema);
  this_02 = (element_type *)operator_new(0x168);
  local_368._M_allocated_capacity =
       (size_type)(schema->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry;
  (schema->super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry = (_func_int **)0x0;
  local_3c0 = bound_defaults;
  BoundCreateTableInfo::BoundCreateTableInfo
            ((BoundCreateTableInfo *)this_02,(SchemaCatalogEntry *)bound_defaults,
             (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
             &local_368._M_allocated_capacity);
  (this->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_02;
  if ((ColumnList *)local_368._M_allocated_capacity != (ColumnList *)0x0) {
    (**(code **)(*(_func_int **)local_368._M_allocated_capacity + 8))();
  }
  pBVar17 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
            ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                          *)this);
  local_2e8.
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.
  super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pCVar16[1].dependencies.set._M_h._M_single_bucket == (__node_base_ptr)0x0) {
    local_2b0._M_unused._M_object = &pBVar17->dependencies;
    local_2b0._8_8_ = local_3c0;
    local_298 = ::std::
                _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create_table.cpp:599:28)>
                ::_M_invoke;
    local_2a0 = ::std::
                _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create_table.cpp:599:28)>
                ::_M_manager;
    SetCatalogLookupCallback((Binder *)info,(catalog_entry_callback_t *)&local_2b0);
    if (local_2a0 != (code *)0x0) {
      (*local_2a0)(&local_2b0,&local_2b0,3);
    }
    pBVar21 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                           *)this);
    CreateColumnDependencyManager(pBVar21);
    pBVar21 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator*((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                           *)this);
    BindGeneratedColumns((Binder *)info,pBVar21);
    paVar1 = &pCVar16[1].catalog.field_2;
    if (pCVar16[1].dependencies.set._M_h._M_buckets !=
        *(__buckets_ptr *)((long)&pCVar16[1].sql.field_2 + 8)) {
      PVar38.index = 0;
      do {
        pCVar31 = ColumnList::GetColumnMutable((ColumnList *)paVar1,PVar38);
        pLVar32 = ColumnDefinition::Type(pCVar31);
        if (pLVar32->id_ == VARCHAR) {
          _Var10._M_head_impl =
               info[2].
               super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
               super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
               .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
          pLVar32 = ColumnDefinition::Type(pCVar31);
          StringType::GetCollation_abi_cxx11_((string *)&local_368,(StringType *)pLVar32,type);
          ExpressionBinder::TestCollation((ClientContext *)_Var10._M_head_impl,(string *)&local_368)
          ;
          if ((ColumnList *)local_368._M_allocated_capacity != (ColumnList *)local_358) {
            operator_delete((void *)local_368._M_allocated_capacity);
          }
        }
        pLVar32 = ColumnDefinition::TypeMutable(pCVar31);
        pBVar17 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                  ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                                *)this);
        oVar11.ptr = (pBVar17->schema->super_InCatalogEntry).catalog;
        pBVar17 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                  ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                                *)this);
        BindLogicalType((Binder *)info,pLVar32,oVar11,
                        &(pBVar17->schema->super_InCatalogEntry).super_CatalogEntry.name);
        PVar38.index = PVar38.index + 1;
      } while (PVar38.index <
               (ulong)((long)pCVar16[1].dependencies.set._M_h._M_buckets -
                       *(long *)((long)&pCVar16[1].sql.field_2 + 8) >> 3));
    }
    local_368._M_allocated_capacity = (size_type)aaStack_338;
    local_368._8_8_ = &DAT_00000001;
    local_358 = (undefined1  [8])0x0;
    pCStack_350 = (pointer)0x0;
    local_348 = 0x3f800000;
    local_340 = (__buckets_ptr)0x0;
    aaStack_338[0]._M_allocated_capacity = 0;
    local_2f0 = &pCVar16[1].dependencies.set._M_h._M_element_count;
    if (*(size_type *)&pCVar16[1].dependencies.set._M_h._M_rehash_policy !=
        pCVar16[1].dependencies.set._M_h._M_element_count) {
      local_2c8 = (CatalogEntryRetriever *)(info + 0x5c);
      local_2b8 = pCVar16 + 1;
      paVar2 = &local_3b8.field_2;
      __n = 0;
      do {
        this_03 = vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                                *)local_2f0,__n);
        pCVar22 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                  operator->(this_03);
        if (pCVar22->type == FOREIGN_KEY) {
          pCVar22 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                    operator->(this_03);
          fk = Constraint::Cast<duckdb::ForeignKeyConstraint>(pCVar22);
          if ((fk->info).type == FK_TYPE_FOREIGN_KEY_TABLE) {
            if (((fk->info).pk_keys.
                 super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                 super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                 _M_impl.super__Vector_impl_data._M_start !=
                 (fk->info).pk_keys.
                 super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                 super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                 _M_impl.super__Vector_impl_data._M_finish) &&
               ((fk->info).fk_keys.
                super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                _M_impl.super__Vector_impl_data._M_start !=
                (fk->info).fk_keys.
                super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>.
                _M_impl.super__Vector_impl_data._M_finish)) break;
            FindForeignKeyIndexes
                      ((duckdb *)paVar1->_M_local_buf,
                       (ColumnList *)
                       (fk->fk_columns).
                       super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                        *)(fk->fk_columns).
                          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,&(fk->info).fk_keys);
            psVar25 = &(fk->info).table;
            bVar13 = StringUtil::CIEquals((string *)local_2b8,psVar25);
            indexes = &(fk->info).pk_keys;
            if (bVar13) {
              (fk->info).type = FK_TYPE_SELF_REFERENCE_TABLE;
              FindMatchingPrimaryKeyColumns
                        ((duckdb *)paVar1->_M_local_buf,
                         (ColumnList *)pCVar16[1].dependencies.set._M_h._M_element_count,
                         *(vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                           **)&pCVar16[1].dependencies.set._M_h._M_rehash_policy,fk);
              FindForeignKeyIndexes
                        ((duckdb *)paVar1->_M_local_buf,
                         (ColumnList *)
                         (fk->pk_columns).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)(fk->pk_columns).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,indexes);
              CheckForeignKeyTypes((ColumnList *)paVar1,(ColumnList *)paVar1,fk);
            }
            else {
              EntryLookupInfo::EntryLookupInfo
                        ((EntryLookupInfo *)local_3f8,TABLE_ENTRY,psVar25,
                         (QueryErrorContext)0xffffffffffffffff);
              local_3b8._M_string_length = 0;
              local_3b8.field_2._M_allocated_capacity =
                   local_3b8.field_2._M_allocated_capacity & 0xffffffffffffff00;
              local_3b8._M_dataplus._M_p = (pointer)paVar2;
              local_390 = CatalogEntryRetriever::GetEntry
                                    (local_2c8,&local_3b8,&(fk->info).schema,
                                     (EntryLookupInfo *)local_3f8,THROW_EXCEPTION);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3b8._M_dataplus._M_p != paVar2) {
                operator_delete(local_3b8._M_dataplus._M_p);
              }
              optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_390);
              if ((local_390.ptr)->type == VIEW_ENTRY) {
                pBVar35 = (BinderException *)__cxa_allocate_exception(0x10);
                local_3b8._M_dataplus._M_p = (pointer)paVar2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_3b8,"cannot reference a VIEW with a FOREIGN KEY","");
                BinderException::BinderException(pBVar35,&local_3b8);
                __cxa_throw(pBVar35,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_390);
              this_01.ptr = local_390.ptr;
              if ((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                   *)local_390.ptr[1].oid != local_3c0) {
                pBVar35 = (BinderException *)__cxa_allocate_exception(0x10);
                local_3b8._M_dataplus._M_p = (pointer)paVar2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_3b8,
                           "Creating foreign keys across different schemas or catalogs is not supported"
                           ,"");
                BinderException::BinderException(pBVar35,&local_3b8);
                __cxa_throw(pBVar35,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
              pCVar23 = TableCatalogEntry::GetColumns((TableCatalogEntry *)local_390.ptr);
              pvVar24 = TableCatalogEntry::GetConstraints((TableCatalogEntry *)this_01.ptr);
              FindMatchingPrimaryKeyColumns
                        ((duckdb *)pCVar23,
                         (ColumnList *)
                         (pvVar24->
                         super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                         ).
                         super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                          *)(pvVar24->
                            super_vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                            ).
                            super__Vector_base<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,fk);
              pCVar23 = TableCatalogEntry::GetColumns((TableCatalogEntry *)this_01.ptr);
              FindForeignKeyIndexes
                        ((duckdb *)pCVar23,
                         (ColumnList *)
                         (fk->pk_columns).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                          *)(fk->pk_columns).
                            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,indexes);
              pCVar23 = TableCatalogEntry::GetColumns((TableCatalogEntry *)this_01.ptr);
              CheckForeignKeyTypes(pCVar23,(ColumnList *)paVar1,fk);
              iVar15 = (*(((StandardEntry *)&(this_01.ptr)->_vptr_CatalogEntry)->
                         super_InCatalogEntry).super_CatalogEntry._vptr_CatalogEntry[0x10])
                                 (this_01.ptr);
              bVar13 = DataTable::HasForeignKeyIndex
                                 ((DataTable *)CONCAT44(extraout_var,iVar15),indexes,
                                  FK_TYPE_PRIMARY_KEY_TABLE);
              if (!bVar13) {
                pbVar37 = (pointer)(local_388 + 0x10);
                local_388._16_2_ = 0x2c;
                local_388._8_8_ = &DAT_00000001;
                local_388._0_8_ = pbVar37;
                StringUtil::Join(&local_3b8,&fk->pk_columns,(string *)local_388);
                if ((pointer)local_388._0_8_ != pbVar37) {
                  operator_delete((void *)local_388._0_8_);
                }
                pBVar35 = (BinderException *)__cxa_allocate_exception(0x10);
                local_388._0_8_ = pbVar37;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_388,
                           "Failed to create foreign key on %s(%s): no UNIQUE or PRIMARY KEY constraint present on these columns"
                           ,"");
                local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                pcVar5 = ((this_01.ptr)->name)._M_dataplus._M_p;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_230,pcVar5,
                           pcVar5 + ((this_01.ptr)->name)._M_string_length);
                local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
                ::std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_250,local_3b8._M_dataplus._M_p,
                           local_3b8._M_dataplus._M_p + local_3b8._M_string_length);
                BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
                          (pBVar35,(string *)local_388,&local_230,&local_250);
                __cxa_throw(pBVar35,&BinderException::typeinfo,::std::runtime_error::~runtime_error)
                ;
              }
            }
          }
        }
        __n = __n + 1;
      } while (__n < (ulong)((long)(*(long *)&pCVar16[1].dependencies.set._M_h._M_rehash_policy -
                                   pCVar16[1].dependencies.set._M_h._M_element_count) >> 3));
    }
    ::std::
    _Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::reference_wrapper<duckdb::SchemaCatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::SchemaCatalogEntry>_>,_std::__detail::_Identity,_duckdb::ReferenceEquality<duckdb::SchemaCatalogEntry>,_duckdb::ReferenceHashFunction<duckdb::SchemaCatalogEntry>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&local_368);
    local_368._M_allocated_capacity = (size_type)aaStack_338;
    local_368._8_8_ = &DAT_00000001;
    local_358 = (undefined1  [8])0x0;
    pCStack_350 = (pointer)0x0;
    local_348 = 0x3f800000;
    local_340 = (__buckets_ptr)0x0;
    aaStack_338[0]._M_allocated_capacity = 0;
    CVar40 = ColumnList::Logical((ColumnList *)paVar1);
    pCVar23 = CVar40.list;
    if (((undefined1  [16])CVar40 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      pCVar7 = (pCVar23->columns).
               super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
               super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      auStack_3f0._16_8_ =
           ((long)pCVar7 -
            (long)(pCVar23->columns).
                  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
                  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
      oVar39.index = ((long)pCVar7 -
                      (long)(pCVar23->columns).
                            super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                            .
                            super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x7b425ed097b425ed;
    }
    else {
      oVar39.index = (long)(pCVar23->physical_columns).
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(pCVar23->physical_columns).
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3;
      auStack_3f0._16_8_ = oVar39.index;
    }
    auStack_3f0._8_8_ = (pointer)0x0;
    auStack_3f0[0] = CVar40.physical;
    local_3f8 = (undefined1  [8])pCVar23;
    while (((auStack_3f0._8_8_ != oVar39.index || (auStack_3f0._16_8_ != oVar39.index)) ||
           (local_3f8 != (undefined1  [8])pCVar23))) {
      pCVar31 = ColumnList::ColumnListIterator::ColumnLogicalIteratorInternal::operator*
                          ((ColumnLogicalIteratorInternal *)local_3f8);
      bVar13 = ColumnDefinition::Generated(pCVar31);
      if (bVar13) {
        psVar25 = ColumnDefinition::Name_abi_cxx11_(pCVar31);
        local_3b8._M_dataplus._M_p = (pointer)&local_368;
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_368,psVar25,&local_3b8);
      }
      auStack_3f0._8_8_ = auStack_3f0._8_8_ + 1;
    }
    if (pCStack_350 != (pointer)0x0) {
      this_06 = (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                pCVar16[1].dependencies.set._M_h._M_element_count;
      puVar8 = *(unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> **)
                &pCVar16[1].dependencies.set._M_h._M_rehash_policy;
      if (this_06 != puVar8) {
        do {
          pCVar22 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
                    operator->(this_06);
          switch(pCVar22->type) {
          case NOT_NULL:
            pCVar22 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                      ::operator->(this_06);
            pNVar26 = Constraint::Cast<duckdb::NotNullConstraint>(pCVar22);
            pCVar31 = ColumnList::GetColumn
                                ((ColumnList *)paVar1,(LogicalIndex)(pNVar26->index).index);
            sVar14 = (string)ColumnDefinition::Generated(pCVar31);
            goto joined_r0x006e7618;
          case CHECK:
            pCVar22 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                      ::operator->(this_06);
            pCVar27 = Constraint::Cast<duckdb::CheckConstraint>(pCVar22);
            local_3f8 = (undefined1  [8])((ulong)local_3f8 & 0xffffffffffffff00);
            expr = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                   ::operator*(&pCVar27->expression);
            ExpressionContainsGeneratedColumn
                      (expr,(unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&local_368,(bool *)local_3f8);
            sVar14 = local_3f8[0];
joined_r0x006e7618:
            if (sVar14 != (string)0x0) {
LAB_006e792d:
              ::std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)&local_368);
              pBVar35 = (BinderException *)__cxa_allocate_exception(0x10);
              local_368._M_allocated_capacity = (size_type)local_358;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_368,
                         "Constraints on generated columns are not supported yet","");
              BinderException::BinderException(pBVar35,(string *)&local_368);
              __cxa_throw(pBVar35,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            break;
          case UNIQUE:
            pCVar22 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>
                      ::operator->(this_06);
            this_04 = Constraint::Cast<duckdb::UniqueConstraint>(pCVar22);
            bVar13 = UniqueConstraint::HasIndex(this_04);
            if (bVar13) {
              logical = UniqueConstraint::GetIndex(this_04);
              pCVar31 = ColumnList::GetColumn((ColumnList *)paVar1,logical);
              sVar14 = (string)ColumnDefinition::Generated(pCVar31);
              goto joined_r0x006e7618;
            }
            pvVar28 = UniqueConstraint::GetColumnNames_abi_cxx11_(this_04);
            pbVar9 = (pvVar28->
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pbVar37 = (pvVar28->
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start; pbVar37 != pbVar9;
                pbVar37 = pbVar37 + 1) {
              cVar29 = ::std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)&local_368,pbVar37);
              if (cVar29.
                  super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  ._M_cur != (__node_type *)0x0) goto LAB_006e792d;
            }
            break;
          case FOREIGN_KEY:
            break;
          default:
            this_05 = (NotImplementedException *)__cxa_allocate_exception(0x10);
            local_3f8 = (undefined1  [8])((long)auStack_3f0 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_3f8,"ConstraintType not implemented","");
            NotImplementedException::NotImplementedException(this_05,(string *)local_3f8);
            __cxa_throw(this_05,&NotImplementedException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          this_06 = this_06 + 1;
        } while (this_06 != puVar8);
      }
    }
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&local_368);
    BindNewConstraints((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                        *)local_3f8,(Binder *)info,
                       (vector<duckdb::unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>,_true>
                        *)local_2f0,(string *)(pCVar16 + 1),(ColumnList *)paVar1);
    local_358 = (undefined1  [8])
                local_2e8.
                super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_368._8_8_ =
         local_2e8.
         super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_368._M_allocated_capacity =
         (size_type)
         local_2e8.
         super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2e8.
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)auStack_3f0._8_8_;
    local_2e8.
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3f8;
    local_2e8.
    super__Vector_base<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)auStack_3f0._0_8_;
    local_3f8 = (undefined1  [8])0x0;
    auStack_3f0._0_8_ = (string *)0x0;
    auStack_3f0._8_8_ = (BoundAtClause *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               *)&local_368);
    ::std::
    vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
               *)local_3f8);
    pCVar30 = (Catalog *)
              (*(code *)(local_3c0->
                        super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ).
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[0xb].
                        super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                        ._M_t)();
    psVar25 = Catalog::GetName_abi_cxx11_(pCVar30);
    BindDefaultValues((Binder *)info,(ColumnList *)paVar1,local_2c0,psVar25,
                      (string *)
                      &local_3c0[1].
                       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       .
                       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    this_00 = &pCVar16[1].dependencies.set._M_h._M_single_bucket;
    stmt = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>::
           operator*((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                      *)this_00);
    Bind((BoundStatement *)local_3f8,(Binder *)info,stmt);
    p_Var3 = *this_00;
    *this_00 = (__node_base_ptr)0x0;
    if (p_Var3 != (__node_base_ptr)0x0) {
      (*(code *)p_Var3->_M_nxt[1]._M_nxt)();
    }
    pBVar17 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                            *)this);
    auVar12 = local_3f8;
    local_3f8 = (undefined1  [8])0x0;
    _Var4._M_head_impl =
         (pBVar17->query).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pBVar17->query).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)auVar12;
    if (_Var4._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var4._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    paVar1 = &pCVar16[1].catalog.field_2;
    ColumnList::GetColumnNames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)local_388,(ColumnList *)paVar1);
    *(undefined1 *)&pCVar16[1].dependencies.set._M_h._M_before_begin._M_nxt = 1;
    if (local_388._0_8_ == local_388._8_8_) {
      if (local_3d8.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          local_3d8.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        sVar36 = 0;
        do {
          pvVar19 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&local_3d8,sVar36);
          pcVar5 = (pvVar19->_M_dataplus)._M_p;
          local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_290,pcVar5,pcVar5 + pvVar19->_M_string_length);
          pvVar20 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)auStack_3f0,sVar36);
          LogicalType::LogicalType(&local_210,pvVar20);
          ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_1e0,&local_290,&local_210);
          ColumnList::AddColumn((ColumnList *)paVar1,(ColumnDefinition *)local_1e0);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)(local_1e0 + 0xa0));
          Value::~Value((Value *)(local_1e0 + 0x60));
          if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               )local_1e0._88_8_ != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)local_1e0._88_8_ + 8))();
          }
          local_1e0._88_8_ =
               (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                )0x0;
          LogicalType::~LogicalType((LogicalType *)(local_1e0 + 0x20));
          if ((undefined1 *)local_1e0._0_8_ != local_1e0 + 0x10) {
            operator_delete((void *)local_1e0._0_8_);
          }
          LogicalType::~LogicalType(&local_210);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p);
          }
          sVar36 = sVar36 + 1;
        } while (sVar36 < (ulong)((long)local_3d8.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_3d8.
                                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
    }
    else {
      sVar36 = (long)(local_388._8_8_ - local_388._0_8_) >> 5;
      uVar18 = ((long)(auStack_3f0._8_8_ - auStack_3f0._0_8_) >> 3) * -0x5555555555555555;
      if (uVar18 < sVar36) {
        pBVar35 = (BinderException *)__cxa_allocate_exception(0x10);
        local_368._M_allocated_capacity = (size_type)local_358;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_368,"Target table has more colum names than query result.","");
        BinderException::BinderException(pBVar35,(string *)&local_368);
        __cxa_throw(pBVar35,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
      if (sVar36 < uVar18) {
        do {
          pvVar19 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[](&local_3d8,sVar36);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_388,pvVar19);
          sVar36 = sVar36 + 1;
        } while (sVar36 < (ulong)(((long)(auStack_3f0._8_8_ - auStack_3f0._0_8_) >> 3) *
                                 -0x5555555555555555));
      }
      ColumnList::ColumnList((ColumnList *)&local_368,false);
      if (local_388._8_8_ != local_388._0_8_) {
        sVar36 = 0;
        do {
          pvVar19 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                  *)local_388,sVar36);
          pcVar5 = (pvVar19->_M_dataplus)._M_p;
          local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_270,pcVar5,pcVar5 + pvVar19->_M_string_length);
          pvVar20 = vector<duckdb::LogicalType,_true>::operator[]
                              ((vector<duckdb::LogicalType,_true> *)auStack_3f0,sVar36);
          LogicalType::LogicalType(&local_1f8,pvVar20);
          ColumnDefinition::ColumnDefinition((ColumnDefinition *)local_108,&local_270,&local_1f8);
          ColumnList::AddColumn((ColumnList *)&local_368,(ColumnDefinition *)local_108);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)(local_108 + 0xa0));
          Value::~Value((Value *)(local_108 + 0x60));
          if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               )local_108._88_8_ != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)local_108._88_8_ + 8))();
          }
          local_108._88_8_ =
               (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
                )0x0;
          LogicalType::~LogicalType((LogicalType *)(local_108 + 0x20));
          if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
            operator_delete((void *)local_108._0_8_);
          }
          LogicalType::~LogicalType(&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_270._M_dataplus._M_p != &local_270.field_2) {
            operator_delete(local_270._M_dataplus._M_p);
          }
          sVar36 = sVar36 + 1;
        } while (sVar36 < (ulong)((long)(local_388._8_8_ - local_388._0_8_) >> 5));
      }
      local_3b8.field_2._M_allocated_capacity = (size_type)pCVar16[1].schema._M_dataplus._M_p;
      pCVar16[1].schema._M_dataplus._M_p = (pointer)local_358;
      local_3b8._M_dataplus._M_p = (pointer)pCVar16[1].catalog.field_2._M_allocated_capacity;
      local_3b8._M_string_length = *(size_type *)((long)&pCVar16[1].catalog.field_2 + 8);
      pCVar16[1].catalog.field_2._M_allocated_capacity = local_368._M_allocated_capacity;
      *(undefined8 *)((long)&pCVar16[1].catalog.field_2 + 8) = local_368._8_8_;
      local_368._M_allocated_capacity = 0;
      local_368._8_8_ = 0;
      local_358 = (undefined1  [8])0x0;
      ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
                ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)
                 &local_3b8);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)&pCVar16[1].schema._M_string_length,
                       (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)(local_358 + 8));
      pvVar6 = *(void **)((long)&pCVar16[1].sql.field_2 + 8);
      *(void **)((long)&pCVar16[1].sql.field_2 + 8) = local_318;
      pCVar16[1].dependencies.set._M_h._M_buckets = &p_Stack_310->_M_nxt;
      pCVar16[1].dependencies.set._M_h._M_bucket_count = (size_type)local_308;
      local_318 = (void *)0x0;
      p_Stack_310 = (__node_base_ptr)0x0;
      local_308 = (pointer)0x0;
      if (pvVar6 == (void *)0x0) {
        *(undefined1 *)&pCVar16[1].dependencies.set._M_h._M_before_begin._M_nxt = local_300;
      }
      else {
        operator_delete(pvVar6);
        *(undefined1 *)&pCVar16[1].dependencies.set._M_h._M_before_begin._M_nxt = local_300;
        if (local_318 != (void *)0x0) {
          operator_delete(local_318);
        }
      }
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(local_358 + 8));
      ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
                ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)
                 &local_368);
    }
    if (pCVar16[1].dependencies.set._M_h._M_buckets !=
        *(__buckets_ptr *)((long)&pCVar16[1].sql.field_2 + 8)) {
      PVar38.index = 0;
      do {
        pCVar31 = ColumnList::GetColumnMutable((ColumnList *)paVar1,PVar38);
        pLVar32 = ColumnDefinition::Type(pCVar31);
        if (pLVar32->id_ == VARCHAR) {
          _Var10._M_head_impl =
               info[2].
               super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
               super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
               _M_t.
               super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
               .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
          pLVar32 = ColumnDefinition::Type(pCVar31);
          StringType::GetCollation_abi_cxx11_((string *)&local_368,(StringType *)pLVar32,type_00);
          ExpressionBinder::TestCollation((ClientContext *)_Var10._M_head_impl,(string *)&local_368)
          ;
          if ((ColumnList *)local_368._M_allocated_capacity != (ColumnList *)local_358) {
            operator_delete((void *)local_368._M_allocated_capacity);
          }
        }
        pLVar32 = ColumnDefinition::TypeMutable(pCVar31);
        pBVar17 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                  ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                                *)this);
        oVar11.ptr = (pBVar17->schema->super_InCatalogEntry).catalog;
        pBVar17 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                  ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                                *)this);
        BindLogicalType((Binder *)info,pLVar32,oVar11,
                        &(pBVar17->schema->super_InCatalogEntry).super_CatalogEntry.name);
        PVar38.index = PVar38.index + 1;
      } while (PVar38.index <
               (ulong)((long)pCVar16[1].dependencies.set._M_h._M_buckets -
                       *(long *)((long)&pCVar16[1].sql.field_2 + 8) >> 3));
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_388);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_3d8);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)auStack_3f0);
    if ((tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)local_3f8
        != (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
      (**(code **)(*(long *)local_3f8 + 8))();
    }
  }
  if (pCVar16[1].dependencies.set._M_h._M_buckets ==
      *(__buckets_ptr *)((long)&pCVar16[1].sql.field_2 + 8)) {
    pBVar35 = (BinderException *)__cxa_allocate_exception(0x10);
    local_368._M_allocated_capacity = (size_type)local_358;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_368,
               "Creating a table without physical (non-generated) columns is not supported","");
    BinderException::BinderException(pBVar35,(string *)&local_368);
    __cxa_throw(pBVar35,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar17 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
            ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                          *)this);
  pCVar30 = *(Catalog **)
             &local_3c0[9].
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data;
  pBVar33 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
            ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                          *)this);
  pCVar16 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
            operator->(&pBVar33->base);
  LogicalDependencyList::VerifyDependencies(&pBVar17->dependencies,pCVar30,(string *)(pCVar16 + 1));
  pSVar34 = GetStatementProperties((Binder *)info);
  pSVar34->allow_stream_result = false;
  ::std::
  vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>_>_>
  ::~vector(&local_2e8);
  return (unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
          )(unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
            )this;
}

Assistant:

unique_ptr<BoundCreateTableInfo> Binder::BindCreateTableInfo(unique_ptr<CreateInfo> info, SchemaCatalogEntry &schema,
                                                             vector<unique_ptr<Expression>> &bound_defaults) {
	auto &base = info->Cast<CreateTableInfo>();
	auto result = make_uniq<BoundCreateTableInfo>(schema, std::move(info));
	auto &dependencies = result->dependencies;

	vector<unique_ptr<BoundConstraint>> bound_constraints;
	if (base.query) {
		// construct the result object
		auto query_obj = Bind(*base.query);
		base.query.reset();
		result->query = std::move(query_obj.plan);

		// construct the set of columns based on the names and types of the query
		auto &names = query_obj.names;
		auto &sql_types = query_obj.types;
		// e.g. create table (col1 ,col2) as QUERY
		// col1 and col2 are the target_col_names
		auto target_col_names = base.columns.GetColumnNames();
		// TODO check  types and target_col_names are mismatch in size
		D_ASSERT(names.size() == sql_types.size());
		base.columns.SetAllowDuplicates(true);
		if (!target_col_names.empty()) {
			if (target_col_names.size() > sql_types.size()) {
				throw BinderException("Target table has more colum names than query result.");
			} else if (target_col_names.size() < sql_types.size()) {
				// filled the target_col_names with the name of query names
				for (idx_t i = target_col_names.size(); i < sql_types.size(); i++) {
					target_col_names.push_back(names[i]);
				}
			}
			ColumnList new_colums;
			for (idx_t i = 0; i < target_col_names.size(); i++) {
				new_colums.AddColumn(ColumnDefinition(target_col_names[i], sql_types[i]));
			}
			base.columns = std::move(new_colums);
		} else {
			for (idx_t i = 0; i < names.size(); i++) {
				base.columns.AddColumn(ColumnDefinition(names[i], sql_types[i]));
			}
		}
		// bind collations to detect any unsupported collation errors
		for (idx_t i = 0; i < base.columns.PhysicalColumnCount(); i++) {
			auto &column = base.columns.GetColumnMutable(PhysicalIndex(i));
			if (column.Type().id() == LogicalTypeId::VARCHAR) {
				ExpressionBinder::TestCollation(context, StringType::GetCollation(column.Type()));
			}
			BindLogicalType(column.TypeMutable(), &result->schema.catalog, result->schema.name);
		}
	} else {
		SetCatalogLookupCallback([&dependencies, &schema](CatalogEntry &entry) {
			if (&schema.ParentCatalog() != &entry.ParentCatalog()) {
				// Don't register dependencies between catalogs
				return;
			}
			dependencies.AddDependency(entry);
		});
		CreateColumnDependencyManager(*result);
		// bind the generated column expressions
		BindGeneratedColumns(*result);
		// bind any constraints

		// bind collations to detect any unsupported collation errors
		for (idx_t i = 0; i < base.columns.PhysicalColumnCount(); i++) {
			auto &column = base.columns.GetColumnMutable(PhysicalIndex(i));
			if (column.Type().id() == LogicalTypeId::VARCHAR) {
				ExpressionBinder::TestCollation(context, StringType::GetCollation(column.Type()));
			}
			BindLogicalType(column.TypeMutable(), &result->schema.catalog, result->schema.name);
		}
		BindCreateTableConstraints(base, entry_retriever, schema);

		if (AnyConstraintReferencesGeneratedColumn(base)) {
			throw BinderException("Constraints on generated columns are not supported yet");
		}
		bound_constraints = BindNewConstraints(base.constraints, base.table, base.columns);
		// bind the default values
		auto &catalog_name = schema.ParentCatalog().GetName();
		auto &schema_name = schema.name;
		BindDefaultValues(base.columns, bound_defaults, catalog_name, schema_name);
	}

	if (base.columns.PhysicalColumnCount() == 0) {
		throw BinderException("Creating a table without physical (non-generated) columns is not supported");
	}

	result->dependencies.VerifyDependencies(schema.catalog, result->Base().table);

	auto &properties = GetStatementProperties();
	properties.allow_stream_result = false;
	return result;
}